

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O2

uint_least64_t anon_unknown.dwarf_ae34::call_function(size_t n)

{
  long lVar1;
  uint_least64_t uVar2;
  long *in_FS_OFFSET;
  bool bVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  scoped_profiler fp_scoped_profiler_fp;
  
  lVar1 = *in_FS_OFFSET;
  uVar2 = 0;
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fp_scoped_profiler_fp,"function",(allocator<char> *)&local_58);
      fp::collector::collector
                ((collector *)(*in_FS_OFFSET + -0x58),(string *)&fp_scoped_profiler_fp);
      std::__cxx11::string::~string((string *)&fp_scoped_profiler_fp);
      __cxa_thread_atexit(fp::collector::~collector,*in_FS_OFFSET + -0x58,&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    fp_scoped_profiler_fp.m_collector = (collector *)(lVar1 + -0x58);
    fp::collector::start((collector *)(lVar1 + -0x58));
    local_58.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
    uVar2 = fp::factorial(0x14);
    fp::scoped_profiler::~scoped_profiler(&fp_scoped_profiler_fp);
  }
  return uVar2;
}

Assistant:

uint_least64_t call_function(size_t n)
{
  uint_least64_t result{0};

  for (size_t i = 0; i < n; ++i) {
    result = function(20);
    fp::keep(result); // avoid optimization
  }

  return result;
}